

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-h1-proxy.c
# Opt level: O0

void cf_h1_proxy_close(Curl_cfilter *cf,Curl_easy *data)

{
  Curl_easy *data_local;
  Curl_cfilter *cf_local;
  
  if ((((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x8ba >> 0x1c & 1) != 0)) &&
      (cf != (Curl_cfilter *)0x0)) && (0 < cf->cft->log_level)) {
    Curl_trc_cf_infof(data,cf,"close");
  }
  cf->field_0x24 = cf->field_0x24 & 0xfe;
  if (cf->ctx != (void *)0x0) {
    h1_tunnel_go_state(cf,(h1_tunnel_state_conflict *)cf->ctx,H1_TUNNEL_INIT,data);
  }
  if (cf->next != (Curl_cfilter *)0x0) {
    (*(code *)cf->next->cft->do_close)(cf->next,data);
  }
  return;
}

Assistant:

static void cf_h1_proxy_close(struct Curl_cfilter *cf,
                              struct Curl_easy *data)
{
  CURL_TRC_CF(data, cf, "close");
  cf->connected = FALSE;
  if(cf->ctx) {
    h1_tunnel_go_state(cf, cf->ctx, H1_TUNNEL_INIT, data);
  }
  if(cf->next)
    cf->next->cft->do_close(cf->next, data);
}